

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

long __thiscall ExactFloat::ToInteger<long>(ExactFloat *this,RoundingMode mode)

{
  int extraout_EAX;
  uint64 uVar1;
  long lVar2;
  long lVar3;
  double __x;
  ExactFloat r;
  ExactFloat local_18;
  
  RoundToPowerOf2(&local_18,(int)this,kRoundTiesToEven);
  if (local_18.bn_exp_ == 0x7ffffffd) {
    lVar3 = 0;
    goto LAB_0026be21;
  }
  lVar3 = 0x7fffffffffffffff;
  if (local_18.bn_exp_ != 0x7ffffffe) {
    if (local_18.bn_exp_ == 0x7fffffff) goto LAB_0026be21;
    exp(&local_18,__x);
    if (extraout_EAX < 0x40) {
      uVar1 = BN_ext_get_uint64(local_18.bn_.bn_);
      lVar2 = uVar1 << ((byte)local_18.bn_exp_ & 0x3f);
      lVar3 = -lVar2;
      if (-1 < local_18.sign_) {
        lVar3 = lVar2;
      }
      goto LAB_0026be21;
    }
  }
  if (local_18.sign_ < 0) {
    lVar3 = -0x8000000000000000;
  }
LAB_0026be21:
  BigNum::~BigNum(&local_18.bn_);
  return lVar3;
}

Assistant:

T ExactFloat::ToInteger(RoundingMode mode) const {
  using std::numeric_limits;
  static_assert(sizeof(T) <= sizeof(uint64), "max 64 bits supported");
  static_assert(numeric_limits<T>::is_signed, "only signed types supported");
  const int64 kMinValue = numeric_limits<T>::min();
  const int64 kMaxValue = numeric_limits<T>::max();

  ExactFloat r = RoundToPowerOf2(0, mode);
  if (r.is_nan()) return kMaxValue;
  if (r.is_zero()) return 0;
  if (!r.is_inf()) {
    // If the unsigned value has more than 63 bits it is always clamped.
    if (r.exp() < 64) {
      int64 value = BN_ext_get_uint64(r.bn_.get()) << r.bn_exp_;
      if (r.sign_ < 0) value = -value;
      return max(kMinValue, min(kMaxValue, value));
    }
  }
  return (r.sign_ < 0) ? kMinValue : kMaxValue;
}